

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::~AMFImporter(AMFImporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0082e078;
  if (this->mReader != (IrrXMLReader *)0x0) {
    (*this->mReader->_vptr_IIrrXMLReader[1])();
  }
  Clear(this);
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::
  _M_clear(&(this->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
          );
  std::__cxx11::
  _List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
  ::_M_clear(&(this->mMaterial_Converted).
              super__List_base<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>
            );
  pcVar2 = (this->mUnit)._M_dataplus._M_p;
  paVar1 = &(this->mUnit).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->mNodeElement_List).
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->mNodeElement_List) {
    p_Var3 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var3;
  }
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

AMFImporter::~AMFImporter()
{
	if(mReader != nullptr) delete mReader;
	// Clear() is accounting if data already is deleted. So, just check again if all data is deleted.
	Clear();
}